

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

void hessian_fdg(custom_gradient *funcgrad,double *x,int N,double *jac,double *dx,double eps2,
                double *H)

{
  int local_48;
  int k;
  int j;
  int i;
  double *H_local;
  double eps2_local;
  double *dx_local;
  double *jac_local;
  int N_local;
  double *x_local;
  custom_gradient *funcgrad_local;
  
  fdjac(funcgrad,x,N,jac,dx,eps2,H);
  for (k = 0; k < N; k = k + 1) {
    for (local_48 = 0; local_48 < N; local_48 = local_48 + 1) {
      H[k * N + local_48] = (H[k * N + local_48] + H[local_48 * N + k]) / 2.0;
    }
  }
  return;
}

Assistant:

void hessian_fdg(custom_gradient *funcgrad, double *x, int N, double *jac, double *dx, double eps2, double *H) {
	int i,j,k;

	fdjac(funcgrad,x,N,jac,dx,eps2,H);

	for(i = 0; i < N;++i) {
		k = i * N;
		for(j = 0; j < N;++j) {
			H[k + j] = (H[k + j] + H[j*N + i]) / 2.0;
		}
	}
}